

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcopy.c
# Opt level: O0

void dcopy_(integer *n,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  int iVar1;
  int local_40;
  integer mp1;
  integer iy;
  integer ix;
  integer m;
  integer i;
  integer *incy_local;
  doublereal *dy_local;
  integer *incx_local;
  doublereal *dx_local;
  integer *n_local;
  
  if (0 < *n) {
    if ((*incx == 1) && (*incy == 1)) {
      iVar1 = *n % 7;
      if (iVar1 != 0) {
        for (ix = 1; ix <= iVar1; ix = ix + 1) {
          dy[ix + -1] = dx[ix + -1];
        }
        if (*n < 7) {
          return;
        }
      }
      for (ix = iVar1 + 1; ix <= *n; ix = ix + 7) {
        dy[ix + -1] = dx[ix + -1];
        dy[ix] = dx[ix];
        dy[ix + 1] = dx[ix + 1];
        dy[ix + 2] = dx[ix + 2];
        dy[ix + 3] = dx[ix + 3];
        dy[ix + 4] = dx[ix + 4];
        dy[ix + 5] = dx[ix + 5];
      }
    }
    else {
      mp1 = 1;
      local_40 = 1;
      if (*incx < 0) {
        mp1 = (1 - *n) * *incx + 1;
      }
      if (*incy < 0) {
        local_40 = (1 - *n) * *incy + 1;
      }
      for (ix = 1; ix <= *n; ix = ix + 1) {
        dy[local_40 + -1] = dx[mp1 + -1];
        mp1 = *incx + mp1;
        local_40 = *incy + local_40;
      }
    }
  }
  return;
}

Assistant:

void dcopy_(integer *n, doublereal *dx, integer *incx, 
	doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     copies a vector, x, to a vector, y.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) = DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 7;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) = DX(i);
/* L30: */
    }
    if (*n < 7) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 7) {
	DY(i) = DX(i);
	DY(i + 1) = DX(i + 1);
	DY(i + 2) = DX(i + 2);
	DY(i + 3) = DX(i + 3);
	DY(i + 4) = DX(i + 4);
	DY(i + 5) = DX(i + 5);
	DY(i + 6) = DX(i + 6);
/* L50: */
    }
    return;
}